

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# print.hpp
# Opt level: O0

void __thiscall
ptc::Print<char>::print_backend<std::ostream&,char_const(&)[13],char_const(&)[12]>
          (Print<char> *this,basic_ostream<char,_std::char_traits<char>_> *os,char (*first) [13],
          char (*args) [12])

{
  bool bVar1;
  ostream *poVar2;
  ulong uVar3;
  bool local_c2;
  byte local_61;
  ANSI local_50 [7];
  ANSI local_34;
  lock_guard<std::mutex> local_30;
  lock_guard<std::mutex> lock;
  char (*args_local) [12];
  char (*first_local) [13];
  basic_ostream<char,_std::char_traits<char>_> *os_local;
  Print<char> *this_local;
  
  lock._M_device = (mutex_type *)args;
  std::lock_guard<std::mutex>::lock_guard(&local_30,(mutex_type *)mutex_);
  local_34 = first;
  bVar1 = is_escape<char[13]>(first,&local_34);
  local_61 = 1;
  if (!bVar1) {
    local_61 = std::__cxx11::string::empty();
  }
  if ((local_61 & 1) == 0) {
    poVar2 = std::operator<<((ostream *)os,(string *)&this->pattern);
    poVar2 = std::operator<<(poVar2,*first);
    std::operator<<(poVar2,(string *)&this->pattern);
  }
  else {
    std::operator<<((ostream *)os,*first);
  }
  local_50[2] = 0;
  bVar1 = is_escape<char[13]>(first,local_50 + 2);
  if (bVar1) {
    uVar3 = std::__cxx11::string::empty();
    if ((uVar3 & 1) == 0) {
      poVar2 = std::operator<<((ostream *)os,(string *)&this->pattern);
      poVar2 = std::operator<<(poVar2,(char *)lock._M_device);
      poVar2 = std::operator<<(poVar2,(string *)&this->pattern);
      std::operator<<(poVar2,(string *)&this->sep);
    }
    else {
      poVar2 = std::operator<<((ostream *)os,(char *)lock._M_device);
      std::operator<<(poVar2,(string *)&this->sep);
    }
  }
  else {
    uVar3 = std::__cxx11::string::empty();
    if ((uVar3 & 1) == 0) {
      poVar2 = std::operator<<((ostream *)os,(string *)&this->sep);
      poVar2 = std::operator<<(poVar2,(string *)&this->pattern);
      poVar2 = std::operator<<(poVar2,(char *)lock._M_device);
      std::operator<<(poVar2,(string *)&this->pattern);
    }
    else {
      poVar2 = std::operator<<((ostream *)os,(string *)&this->sep);
      std::operator<<(poVar2,(char *)lock._M_device);
    }
  }
  std::operator<<((ostream *)os,(string *)this);
  local_50[1] = 1;
  bVar1 = is_escape<char[13]>(first,local_50 + 1);
  local_c2 = true;
  if (!bVar1) {
    local_50[0] = generic;
    local_c2 = is_escape<char[12]>((char (*) [12])lock._M_device,local_50);
  }
  if (local_c2 != false) {
    std::operator<<((ostream *)os,"\x1b[0m");
  }
  if ((this->flush & 1U) != 0) {
    std::ostream::operator<<((ostream *)os,std::flush<char,std::char_traits<char>>);
  }
  std::lock_guard<std::mutex>::~lock_guard(&local_30);
  return;
}

Assistant:

void print_backend( T_os&& os, T&& first, Args&&... args ) const
     {
      std::lock_guard <std::mutex> lock{ mutex_ };

      // Printing the first argument
      if( is_escape( first, ANSI::first ) || pattern.empty() ) os << first;
      else os << pattern << first << pattern;
      
      // Printing all the other arguments
      if constexpr( sizeof...( args ) > 0 ) 
       {
        if ( is_escape( first, ANSI::first ) ) 
         {
          if( pattern.empty() ) ( ( os << args << sep ), ...);
          else ( ( os << pattern << args << pattern << sep ), ...);
         }
        else 
         {
          if( pattern.empty() ) ( ( os << sep << args ), ...);
          else ( ( os << sep << pattern << args << pattern ), ...);
         }
       }
      os << end;
      
      // Resetting the stream from ANSI escape sequences
      if constexpr( sizeof...( args ) > 0 )
       {
        if ( is_escape( first, ANSI::generic ) || ( ( is_escape( args, ANSI::generic ) ) || ...) )
         {
          os << "\033[0m";
         }
       }
      else 
       {
       if ( is_escape( first, ANSI::generic ) ) 
        {
         os << "\033[0m";
        }
       }

      // Other operations
      if ( flush ) os << std::flush;
     }